

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TableSetColumnWidth(int column_n,float width)

{
  ImSpan<ImGuiTableColumn> *this;
  float fVar1;
  float fVar2;
  ImGuiTable *pIVar3;
  undefined1 auVar4 [16];
  int iVar5;
  ImGuiTableColumn *pIVar6;
  ImGuiTableColumn *pIVar7;
  int column_n_1;
  int iVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float local_48;
  undefined1 local_38 [4];
  undefined1 auStack_34 [12];
  
  pIVar3 = GImGui->CurrentTable;
  if ((pIVar3 == (ImGuiTable *)0x0) || (pIVar3->IsLayoutLocked != false)) {
    __assert_fail("table != __null && table->IsLayoutLocked == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                  ,0x25e7,"void ImGui::TableSetColumnWidth(int, float)");
  }
  if ((-1 < column_n) && (column_n < pIVar3->ColumnsCount)) {
    this = &pIVar3->Columns;
    pIVar6 = ImSpan<ImGuiTableColumn>::operator[](this,column_n);
    fVar11 = (GImGui->Style).FramePadding.x;
    if ((pIVar3->Flags & 0x2000000) == 0) {
      fVar10 = ((pIVar3->WorkRect).Max.x - pIVar6->MinX) -
               (float)(~(int)pIVar6->IndexWithinVisibleSet + (int)pIVar3->ColumnsVisibleCount) *
               fVar11;
    }
    else {
      fVar10 = 3.4028235e+38;
    }
    if (width <= fVar10) {
      fVar10 = width;
    }
    fVar10 = (float)(-(uint)(width < fVar11) & (uint)fVar11 |
                    ~-(uint)(width < fVar11) & (uint)fVar10);
    if ((pIVar6->WidthGiven != fVar10) || (NAN(pIVar6->WidthGiven) || NAN(fVar10))) {
      if ((pIVar6->WidthRequest != fVar10) || (NAN(pIVar6->WidthRequest) || NAN(fVar10))) {
        if (pIVar6->NextVisibleColumn == -1) {
          pIVar7 = (ImGuiTableColumn *)0x0;
        }
        else {
          auStack_34 = (undefined1  [12])0x0;
          pIVar7 = ImSpan<ImGuiTableColumn>::operator[](this,(int)pIVar6->NextVisibleColumn);
        }
        pIVar3->IsSettingsDirty = true;
        if ((pIVar6->Flags & 8U) == 0) {
          if ((pIVar6->Flags & 4U) != 0) {
            if (pIVar7 == (ImGuiTableColumn *)0x0) {
              if (pIVar6->PrevVisibleColumn == -1) {
                return;
              }
              auStack_34 = (undefined1  [12])0x0;
              pIVar7 = ImSpan<ImGuiTableColumn>::operator[](this,(int)pIVar6->PrevVisibleColumn);
            }
            if ((pIVar7->Flags & 8) == 0) {
              fVar1 = pIVar7->WidthRequest;
              fVar2 = pIVar6->WidthRequest;
              fVar10 = fVar1 - (fVar10 - fVar2);
              uVar9 = -(uint)(fVar11 <= fVar10);
              fVar11 = (float)(~uVar9 & (uint)fVar11 | (uint)fVar10 & uVar9);
              pIVar7->WidthRequest = fVar11;
              pIVar6->WidthRequest = (fVar1 + fVar2) - fVar11;
              if (pIVar3->LeftMostStretchedColumnDisplayOrder == -1) {
                __assert_fail("table->LeftMostStretchedColumnDisplayOrder != -1",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                              ,0x25c9,"void TableUpdateColumnsWeightFromWidth(ImGuiTable *)");
              }
              auVar4._12_4_ = 0;
              auVar4._0_12_ = auStack_34;
              _local_38 = auVar4 << 0x20;
              iVar8 = 0;
              local_48 = 0.0;
              while( true ) {
                iVar5 = pIVar3->ColumnsCount;
                if (iVar5 <= iVar8) break;
                pIVar6 = ImSpan<ImGuiTableColumn>::operator[](this,iVar8);
                if ((pIVar6->IsVisible == true) && ((pIVar6->Flags & 4) != 0)) {
                  local_48 = local_48 + pIVar6->StretchWeight;
                  local_38 = (undefined1  [4])((float)local_38 + pIVar6->WidthRequest);
                }
                iVar8 = iVar8 + 1;
              }
              if ((local_48 <= 0.0) || ((float)local_38 <= 0.0)) {
                __assert_fail("visible_weight > 0.0f && visible_width > 0.0f",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                              ,0x25d6,"void TableUpdateColumnsWeightFromWidth(ImGuiTable *)");
              }
              for (iVar8 = 0; iVar8 < iVar5; iVar8 = iVar8 + 1) {
                pIVar6 = ImSpan<ImGuiTableColumn>::operator[](this,iVar8);
                if ((pIVar6->IsVisible == true) && ((pIVar6->Flags & 4) != 0)) {
                  pIVar6->StretchWeight =
                       ((pIVar6->WidthRequest + 0.0) / (float)local_38) * local_48;
                }
                iVar5 = pIVar3->ColumnsCount;
              }
            }
            else {
              fVar10 = (pIVar6->WidthGiven - fVar10) + pIVar7->WidthGiven;
              uVar9 = -(uint)(fVar10 <= fVar11);
              pIVar7->WidthRequest = (float)(uVar9 & (uint)fVar11 | ~uVar9 & (uint)fVar10);
            }
          }
        }
        else {
          if ((((pIVar7 != (ImGuiTableColumn *)0x0) && ((pIVar7->Flags & 8) != 0)) &&
              (pIVar3->LeftMostStretchedColumnDisplayOrder != -1)) &&
             (pIVar3->LeftMostStretchedColumnDisplayOrder < pIVar6->DisplayOrder)) {
            fVar10 = pIVar7->WidthRequest - (fVar10 - pIVar6->WidthRequest);
            uVar9 = -(uint)(fVar11 <= fVar10);
            fVar11 = (float)(~uVar9 & (uint)fVar11 | (uint)fVar10 & uVar9);
            fVar10 = (pIVar7->WidthRequest + pIVar6->WidthRequest) - fVar11;
            pIVar7->WidthRequest = fVar11;
          }
          pIVar6->WidthRequest = fVar10;
        }
      }
    }
    return;
  }
  __assert_fail("column_n >= 0 && column_n < table->ColumnsCount",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                ,0x25e8,"void ImGui::TableSetColumnWidth(int, float)");
}

Assistant:

void ImGui::TableSetColumnWidth(int column_n, float width)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && table->IsLayoutLocked == false);
    IM_ASSERT(column_n >= 0 && column_n < table->ColumnsCount);
    ImGuiTableColumn* column_0 = &table->Columns[column_n];
    float column_0_width = width;

    // Constraints
    const float min_width = TableGetMinColumnWidth();
    float max_width_0 = FLT_MAX;
    if (!(table->Flags & ImGuiTableFlags_ScrollX))
        max_width_0 = (table->WorkRect.Max.x - column_0->MinX) - (table->ColumnsVisibleCount - (column_0->IndexWithinVisibleSet + 1)) * min_width;
    column_0_width = ImClamp(column_0_width, min_width, max_width_0);

    // Compare both requested and actual given width to avoid overwriting requested width when column is stuck (minimum size, bounded)
    if (column_0->WidthGiven == column_0_width || column_0->WidthRequest == column_0_width)
        return;

    ImGuiTableColumn* column_1 = (column_0->NextVisibleColumn != -1) ? &table->Columns[column_0->NextVisibleColumn] : NULL;

    // In this surprisingly not simple because of how we support mixing Fixed and Stretch columns.
    // When forwarding resize from Wn| to Fn+1| we need to be considerate of the _NoResize flag on Fn+1.
    // FIXME-TABLE: Find a way to rewrite all of this so interactions feel more consistent for the user.
    // Scenarios:
    // - F1 F2 F3  resize from F1| or F2|   --> ok: alter ->WidthRequested of Fixed column. Subsequent columns will be offset.
    // - F1 F2 F3  resize from F3|          --> ok: alter ->WidthRequested of Fixed column. If active, ScrollX extent can be altered.
    // - F1 F2 W3  resize from F1| or F2|   --> ok: alter ->WidthRequested of Fixed column. If active, ScrollX extent can be altered, but it doesn't make much sense as the Stretch column will always be minimal size.
    // - F1 F2 W3  resize from W3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 W2 W3  resize from W1| or W2|   --> FIXME
    // - W1 W2 W3  resize from W3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 F2 F3  resize from F3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 F2     resize from F2|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 W2 F3  resize from W1| or W2|   --> ok
    // - W1 F2 W3  resize from W1| or F2|   --> FIXME
    // - F1 W2 F3  resize from W2|          --> ok
    // - W1 F2 F3  resize from W1|          --> ok: equivalent to resizing |F2. F3 will not move. (forwarded by Resize Rule 2)
    // - W1 F2 F3  resize from F2|          --> FIXME should resize F2, F3 and not have effect on W1 (Stretch columns are _before_ the Fixed column).

    // Rules:
    // - [Resize Rule 1] Can't resize from right of right-most visible column if there is any Stretch column. Implemented in TableUpdateLayout().
    // - [Resize Rule 2] Resizing from right-side of a Stretch column before a fixed column forward sizing to left-side of fixed column.
    // - [Resize Rule 3] If we are are followed by a fixed column and we have a Stretch column before, we need to ensure that our left border won't move.
    table->IsSettingsDirty = true;
    if (column_0->Flags & ImGuiTableColumnFlags_WidthFixed)
    {
        // [Resize Rule 3] If we are are followed by a fixed column and we have a Stretch column before, we need to ensure
        // that our left border won't move, which we can do by making sure column_a/column_b resizes cancels each others.
        if (column_1 && (column_1->Flags & ImGuiTableColumnFlags_WidthFixed))
            if (table->LeftMostStretchedColumnDisplayOrder != -1 && table->LeftMostStretchedColumnDisplayOrder < column_0->DisplayOrder)
            {
                // (old_a + old_b == new_a + new_b) --> (new_a == old_a + old_b - new_b)
                float column_1_width = ImMax(column_1->WidthRequest - (column_0_width - column_0->WidthRequest), min_width);
                column_0_width = column_0->WidthRequest + column_1->WidthRequest - column_1_width;
                column_1->WidthRequest = column_1_width;
            }

        // Apply
        //IMGUI_DEBUG_LOG("TableSetColumnWidth(%d, %.1f->%.1f)\n", column_0_idx, column_0->WidthRequested, column_0_width);
        column_0->WidthRequest = column_0_width;
    }
    else if (column_0->Flags & ImGuiTableColumnFlags_WidthStretch)
    {
        // We can also use previous column if there's no next one
        if (column_1 == NULL)
            column_1 = (column_0->PrevVisibleColumn != -1) ? &table->Columns[column_0->PrevVisibleColumn] : NULL;
        if (column_1 == NULL)
            return;

        if (column_1->Flags & ImGuiTableColumnFlags_WidthFixed)
        {
            // [Resize Rule 2]
            float off = (column_0->WidthGiven - column_0_width);
            float column_1_width = column_1->WidthGiven + off;
            column_1->WidthRequest = ImMax(min_width, column_1_width);
        }
        else
        {
            // (old_a + old_b == new_a + new_b) --> (new_a == old_a + old_b - new_b)
            float column_1_width = ImMax(column_1->WidthRequest - (column_0_width - column_0->WidthRequest), min_width);
            column_0_width = column_0->WidthRequest + column_1->WidthRequest - column_1_width;
            column_1->WidthRequest = column_1_width;
            column_0->WidthRequest = column_0_width;
            TableUpdateColumnsWeightFromWidth(table);
        }
    }
}